

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

FilePath __thiscall testing::internal::FilePath::RemoveTrailingPathSeparator(FilePath *this)

{
  char *__src;
  ulong uVar1;
  char *__dest;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t sVar2;
  String *in_RSI;
  FilePath FVar3;
  String local_38;
  
  __src = in_RSI->c_str_;
  uVar1 = in_RSI->length_;
  if ((__src == (char *)0x0 || uVar1 != 0) && (__src[uVar1 - 1] == '/')) {
    __dest = (char *)operator_new__(uVar1);
    memcpy(__dest,__src,uVar1 - 1);
    __dest[uVar1 - 1] = '\0';
    local_38.c_str_ = __dest;
    local_38.length_ = uVar1 - 1;
    FilePath(this,&local_38);
    sVar2 = extraout_RDX;
    if (local_38.c_str_ != (char *)0x0) {
      operator_delete__(local_38.c_str_);
      sVar2 = extraout_RDX_00;
    }
  }
  else {
    (this->pathname_).c_str_ = (char *)0x0;
    (this->pathname_).length_ = 0;
    String::operator=(&this->pathname_,in_RSI);
    sVar2 = extraout_RDX_01;
  }
  FVar3.pathname_.length_ = sVar2;
  FVar3.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar3.pathname_;
}

Assistant:

FilePath FilePath::RemoveTrailingPathSeparator() const {
  return IsDirectory()
      ? FilePath(String(pathname_.c_str(), pathname_.length() - 1))
      : *this;
}